

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O2

void __thiscall PartVolumeButton::paintEvent(PartVolumeButton *this,QPaintEvent *param_1)

{
  char cVar1;
  long *plVar2;
  QIcon icon;
  QStylePainter painter;
  QRect local_70;
  QSize local_60;
  QStyleOptionFocusRect opt;
  
  QStylePainter::QStylePainter(&painter,(QWidget *)this);
  plVar2 = (long *)QWidget::style();
  (**(code **)(*plVar2 + 0x100))(&icon,plVar2,0 < this->volume ^ 0x45,0,0);
  local_70 = QWidget::rect((QWidget *)this);
  local_60 = QWidget::size((QWidget *)this);
  QIcon::pixmap((QSize *)&opt,(Mode)&icon,(State)&local_60);
  (**(code **)(*(long *)painter.wstyle + 0xa0))(painter.wstyle,&painter,&local_70,0x84,&opt);
  QPixmap::~QPixmap((QPixmap *)&opt);
  cVar1 = QWidget::hasFocus();
  if (cVar1 != '\0') {
    QStyleOptionFocusRect::QStyleOptionFocusRect(&opt);
    QStyleOption::initFrom((QWidget *)&opt);
    QStylePainter::drawPrimitive(&painter,PE_FrameFocusRect,(QStyleOption *)&opt);
    QStyleOption::~QStyleOption((QStyleOption *)&opt);
  }
  QIcon::~QIcon(&icon);
  QPainter::~QPainter(&painter.super_QPainter);
  return;
}

Assistant:

void PartVolumeButton::paintEvent(QPaintEvent*) {
	QStylePainter painter(this);
	QIcon icon = style()->standardIcon(volume > 0 ? QStyle::SP_MediaVolume : QStyle::SP_MediaVolumeMuted);
	painter.drawItemPixmap(rect(), Qt::AlignCenter, icon.pixmap(size()));
	if (hasFocus()) {
		QStyleOptionFocusRect opt;
		opt.initFrom(this);
		painter.drawPrimitive(QStyle::PE_FrameFocusRect, opt);
	}
}